

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# node.c
# Opt level: O1

void ixmlNode_getElementsByTagName(IXML_Node *n,char *tagname,IXML_NodeList **list)

{
  int iVar1;
  
  if ((n == (IXML_Node *)0x0) || (tagname == (char *)0x0)) {
    __assert_fail("n != NULL && tagname != NULL",
                  "/workspace/llm4binary/github/license_c_cmakelists/pupnp[P]pupnp/ixml/src/node.c",
                  0x4fd,
                  "void ixmlNode_getElementsByTagName(IXML_Node *, const char *, IXML_NodeList **)")
    ;
  }
  if ((short)n->nodeType == eELEMENT_NODE) {
    iVar1 = strcmp(tagname,n->nodeName);
    if (iVar1 != 0) {
      iVar1 = strcmp(tagname,"*");
      if (iVar1 != 0) goto LAB_00128f5c;
    }
    ixmlNodeList_addToNodeList(list,n);
  }
LAB_00128f5c:
  ixmlNode_getElementsByTagNameRecursive(n->firstChild,tagname,list);
  return;
}

Assistant:

void ixmlNode_getElementsByTagName(
	IXML_Node *n, const char *tagname, IXML_NodeList **list)
{
	const char *name;

	assert(n != NULL && tagname != NULL);

	if (ixmlNode_getNodeType(n) == eELEMENT_NODE) {
		name = ixmlNode_getNodeName(n);
		if (strcmp(tagname, name) == 0 || strcmp(tagname, "*") == 0) {
			ixmlNodeList_addToNodeList(list, n);
		}
	}
	ixmlNode_getElementsByTagNameRecursive(
		ixmlNode_getFirstChild(n), tagname, list);
}